

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

long __thiscall tetgenmesh::removeslivers(tetgenmesh *this,int chkencflag)

{
  uint *puVar1;
  double cosd;
  arraypool *this_00;
  ulong uVar2;
  memorypool *pmVar3;
  void **ppvVar4;
  int iVar5;
  arraypool *paVar6;
  char *pcVar7;
  long *plVar8;
  char *pcVar9;
  long lVar10;
  triface *ptVar11;
  long lVar12;
  undefined8 uVar13;
  long lVar14;
  undefined8 uVar15;
  byte bVar16;
  tetrahedron *pppdVar17;
  long local_a0;
  double maxcosd;
  long local_88;
  undefined8 local_80;
  triface local_78;
  double cosdd [6];
  
  bVar16 = 0;
  uVar15 = 0;
  local_78.tet = (tetrahedron *)0x0;
  paVar6 = (arraypool *)operator_new(0x30);
  paVar6->objectbytes = 0x88;
  paVar6->objectsperblock = 0x400;
  paVar6->log2objectsperblock = 10;
  paVar6->objectsperblockmark = 0x3ff;
  paVar6->toparraylen = 0;
  paVar6->toparray = (char **)0x0;
  paVar6->objects = 0;
  paVar6->totalmemory = 0;
  lVar10 = 0;
  uVar13 = 0;
  do {
    this_00 = this->unflipqueue;
    this->unflipqueue = paVar6;
    if ((this_00->objects < 1) || (this->steinerleft == 0)) break;
    local_88 = lVar10;
    local_80 = uVar15;
    if (this->b->verbose < 2) {
LAB_0014d6f4:
      lVar10 = 0;
      local_a0 = 0;
LAB_0014d6ff:
      pcVar7 = this_00->toparray[(uint)lVar10 >> ((byte)this_00->log2objectsperblock & 0x1f)];
      lVar14 = (long)this_00->objectbytes * (long)(int)(this_00->objectsperblockmark & (uint)lVar10)
      ;
      ptVar11 = (triface *)(pcVar7 + lVar14);
      iVar5 = gettetrahedron(this,*(point *)(pcVar7 + lVar14 + 0x58),
                             *(point *)(pcVar7 + lVar14 + 0x60),*(point *)(pcVar7 + lVar14 + 0x68),
                             *(point *)(pcVar7 + lVar14 + 0x70),ptVar11);
      if (iVar5 != 0) {
        pppdVar17 = ptVar11[2].tet;
        if ((((double)pppdVar17 == 0.0) && (!NAN((double)pppdVar17))) || (ptVar11->ver != 0xb)) {
          pppdVar17 = ptVar11->tet;
          tetalldihedral(this,(point)pppdVar17[4],(point)pppdVar17[5],(point)pppdVar17[6],
                         (point)pppdVar17[7],(double *)&ptVar11[2].ver,(double *)(ptVar11 + 2),
                         (double *)0x0);
          pppdVar17 = ptVar11[2].tet;
        }
        if ((double)pppdVar17 < this->cosslidihed) {
          local_78.tet = ptVar11->tet;
          lVar14 = 0;
LAB_0014d7b7:
          cosd = *(double *)((long)&ptVar11[2].ver + lVar14 * 2);
          if (this->cosslidihed <= cosd) goto LAB_0014d7f1;
          local_78.ver = *(int *)((long)edge2ver + lVar14);
          iVar5 = splitsliver(this,&local_78,cosd,chkencflag);
          if (iVar5 == 0) goto LAB_0014d7f1;
          pmVar3 = this->badtetrahedrons;
          ppvVar4 = pmVar3->firstblock;
          pmVar3->pathblock = ppvVar4;
          pmVar3->pathitem =
               (void *)((long)ppvVar4 +
                       (((long)pmVar3->alignbytes + 8U) -
                       (ulong)(ppvVar4 + 1) % (ulong)(long)pmVar3->alignbytes));
          pmVar3->pathitemsleft = pmVar3->itemsperblock;
          plVar8 = (long *)memorypool::traverse(pmVar3);
          while (plVar8 != (long *)0x0) {
            lVar14 = *plVar8;
            puVar1 = (uint *)(lVar14 + (long)this->elemmarkerindex * 4);
            *puVar1 = *puVar1 & 0xffffefff;
            tetalldihedral(this,*(point *)(lVar14 + 0x20),*(point *)(lVar14 + 0x28),
                           *(point *)(lVar14 + 0x30),*(point *)(lVar14 + 0x38),cosdd,&maxcosd,
                           (double *)0x0);
            if (maxcosd < this->cosslidihed) {
              paVar6 = this->unflipqueue;
              pcVar9 = arraypool::getblock(paVar6,(int)paVar6->objects);
              lVar12 = (long)paVar6->objectbytes *
                       ((long)paVar6->objectsperblock - 1U & paVar6->objects);
              paVar6->objects = paVar6->objects + 1;
              *(undefined8 *)(pcVar9 + lVar12 + 0x58) = *(undefined8 *)(lVar14 + 0x20);
              *(undefined8 *)(pcVar9 + lVar12 + 0x60) = *(undefined8 *)(lVar14 + 0x28);
              *(undefined8 *)(pcVar9 + lVar12 + 0x68) = *(undefined8 *)(lVar14 + 0x30);
              *(undefined8 *)(pcVar9 + lVar12 + 0x70) = *(undefined8 *)(lVar14 + 0x38);
              *(long *)(pcVar9 + lVar12) = *plVar8;
              pcVar7 = pcVar9 + lVar12 + 8;
              pcVar7[0] = '\v';
              pcVar7[1] = '\0';
              pcVar7[2] = '\0';
              pcVar7[3] = '\0';
              *(double *)(pcVar9 + lVar12 + 0x20) = maxcosd;
              lVar14 = 0;
              do {
                *(double *)(pcVar9 + lVar14 * 8 + lVar12 + 0x28) = cosdd[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 6);
            }
            plVar8 = (long *)memorypool::traverse(this->badtetrahedrons);
          }
          local_a0 = local_a0 + 1;
          pmVar3 = this->badtetrahedrons;
          pmVar3->items = 0;
          pmVar3->maxitems = 0;
          ppvVar4 = pmVar3->firstblock;
          pmVar3->nowblock = ppvVar4;
          pmVar3->nextitem =
               (void *)((long)ppvVar4 +
                       (((long)pmVar3->alignbytes + 8U) -
                       (ulong)(ppvVar4 + 1) % (ulong)(long)pmVar3->alignbytes));
          pmVar3->unallocateditems = pmVar3->itemsperblock;
          pmVar3->deaditemstack = (void *)0x0;
        }
      }
      goto LAB_0014d9cf;
    }
    printf("    Splitting bad quality tets [%d]#:  %ld.\n",uVar13);
    if (this_00->objects < 1) {
      local_a0 = 0;
    }
    else {
      local_a0 = 0;
      if (this->steinerleft != 0) goto LAB_0014d6f4;
    }
LAB_0014d9f1:
    this_00->objects = 0;
    if (1 < this->b->verbose) {
      printf("    Split %ld tets.\n",local_a0);
    }
    lVar10 = local_88 + local_a0;
    uVar13 = 1;
    uVar15 = CONCAT71((int7)((ulong)local_a0 >> 8),1);
    paVar6 = this_00;
  } while ((~(byte)local_80 & local_a0 != 0) != 0);
  arraypool::~arraypool(this_00);
  operator_delete(this_00,0x30);
  return lVar10;
LAB_0014d7f1:
  lVar14 = lVar14 + 4;
  if (lVar14 == 0x18) goto code_r0x0014d7fb;
  goto LAB_0014d7b7;
code_r0x0014d7fb:
  paVar6 = this->unflipqueue;
  pcVar7 = arraypool::getblock(paVar6,(int)paVar6->objects);
  uVar2 = paVar6->objects;
  paVar6->objects = uVar2 + 1;
  pcVar7 = pcVar7 + (long)paVar6->objectbytes * ((long)paVar6->objectsperblock - 1U & uVar2);
  *(tetrahedron **)pcVar7 = ptVar11->tet;
  *(int *)(pcVar7 + 8) = ptVar11->ver;
  *(tetrahedron **)(pcVar7 + 0x10) = ptVar11[1].tet;
  *(int *)(pcVar7 + 0x18) = ptVar11[1].ver;
  ptVar11 = ptVar11 + 2;
  pcVar7 = pcVar7 + 0x20;
  for (lVar14 = 0xd; lVar14 != 0; lVar14 = lVar14 + -1) {
    *(tetrahedron **)pcVar7 = ptVar11->tet;
    ptVar11 = (triface *)&ptVar11[-(ulong)bVar16].ver;
    pcVar7 = pcVar7 + (ulong)bVar16 * -0x10 + 8;
  }
LAB_0014d9cf:
  lVar10 = lVar10 + 1;
  if ((this_00->objects <= lVar10) || (this->steinerleft == 0)) goto LAB_0014d9f1;
  goto LAB_0014d6ff;
}

Assistant:

long tetgenmesh::removeslivers(int chkencflag)
{
  arraypool *flipqueue, *swapqueue;
  badface *bface, *parybface;
  triface slitet, *parytet;
  point *ppt;
  REAL cosdd[6], maxcosd;
  long totalsptcount, sptcount;
  int iter, i, j, k;

  //assert(unflipqueue->objects > 0l);
  flipqueue = new arraypool(sizeof(badface), 10);

  // Swap the two flip queues.
  swapqueue = flipqueue;
  flipqueue = unflipqueue;
  unflipqueue = swapqueue;

  totalsptcount = 0l;
  iter = 0;

  while ((flipqueue->objects > 0l) && (steinerleft != 0)) {

    sptcount = 0l;

    if (b->verbose > 1) {
      printf("    Splitting bad quality tets [%d]#:  %ld.\n",
             iter, flipqueue->objects);
    }

    for (k = 0; (k < flipqueue->objects) && (steinerleft != 0); k++) {      
      bface  = (badface *) fastlookup(flipqueue, k);
      if (gettetrahedron(bface->forg, bface->fdest, bface->fapex,
                         bface->foppo, &bface->tt)) {
        if ((bface->key == 0) || (bface->tt.ver != 11)) {
          // Here we need to re-compute the quality. Since other smoothing
          //   operation may have moved the vertices of this tet.
          ppt = (point *) & (bface->tt.tet[4]);
          tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], bface->cent, 
                         &bface->key, NULL);
        }
        if (bface->key < cosslidihed) { 
          // It is a sliver. Try to split it.
          slitet.tet = bface->tt.tet;
          //cosdd = bface->cent;
          for (j = 0; j < 6; j++) {
            if (bface->cent[j] < cosslidihed) { 
              // Found a large dihedral angle.
              slitet.ver = edge2ver[j]; // Go to the edge.
              if (splitsliver(&slitet, bface->cent[j], chkencflag)) {
                sptcount++;
                break;
              }
            }
          } // j
          if (j < 6) {
            // A sliver is split. Queue new slivers.
            badtetrahedrons->traversalinit();
            parytet = (triface *) badtetrahedrons->traverse();
            while (parytet != NULL) {
              unmarktest2(*parytet);
              ppt = (point *) & (parytet->tet[4]);
              tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], cosdd, 
                             &maxcosd, NULL);
              if (maxcosd < cosslidihed) {
                // A new sliver. Queue it.
                unflipqueue->newindex((void **) &parybface);
                parybface->forg = ppt[0];
                parybface->fdest = ppt[1];
                parybface->fapex = ppt[2];
                parybface->foppo = ppt[3];
                parybface->tt.tet = parytet->tet;
                parybface->tt.ver = 11;
                parybface->key = maxcosd;
                for (i = 0; i < 6; i++) {
                  parybface->cent[i] = cosdd[i];
                }
              }
              parytet = (triface *) badtetrahedrons->traverse();
            }
            badtetrahedrons->restart();
          } else {
            // Didn't split. Queue it again.
            unflipqueue->newindex((void **) &parybface);
            *parybface = *bface;
          } // if (j == 6)
        } // if (bface->key < cosslidihed)
      } // if (gettetrahedron(...))
    } // k

    flipqueue->restart();

    if (b->verbose > 1) {
      printf("    Split %ld tets.\n", sptcount);
    }
    totalsptcount += sptcount;

    if (sptcount == 0l) {
      // No point has been smoothed. 
      break;
    } else {
      iter++;
      if (iter == 2) { //if (iter >= b->optpasses) {
        break;
      }
    }

    // Swap the two flip queues.
    swapqueue = flipqueue;
    flipqueue = unflipqueue;
    unflipqueue = swapqueue;
  } // while

  delete flipqueue;

  return totalsptcount;
}